

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VANAnalyzer.cpp
# Opt level: O1

void __thiscall VanAnalyzer::VanAnalyzer(VanAnalyzer *this)

{
  VanAnalyzerSettings *this_00;
  long lVar1;
  undefined **ppuVar2;
  char **ppcVar3;
  byte bVar4;
  
  bVar4 = 0;
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__VanAnalyzer_0010ac58;
  ppuVar2 = &PTR_anon_var_dwarf_2f_0010ac98;
  ppcVar3 = this->VanFrameTypeForDisplay;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *ppcVar3 = *ppuVar2;
    ppuVar2 = ppuVar2 + (ulong)bVar4 * -2 + 1;
    ppcVar3 = ppcVar3 + (ulong)bVar4 * -2 + 1;
  }
  this_00 = (VanAnalyzerSettings *)operator_new(0x40);
  VanAnalyzerSettings::VanAnalyzerSettings(this_00);
  (this->mSettings)._M_ptr = this_00;
  (this->mResults)._M_ptr = (VanAnalyzerResults *)0x0;
  this->mBitPositions[0] = 0;
  this->mBitPositions[1] = 0;
  this->mBitPositions[2] = 0;
  this->mBitPositions[3] = 0;
  this->mBitPositions[4] = 0;
  this->mBitPositions[5] = 0;
  this->mBitPos = '\0';
  this->mStartOfFieldSampleNumber = 0;
  this->mStartOfIdenFieldSampleNumber = 0;
  *(undefined8 *)((long)&this->mStartOfIdenFieldSampleNumber + 3) = 0;
  *(undefined8 *)((long)&this->mPreviousNonManchesterBitPosition + 3) = 0;
  this->mask = 0x80;
  this->mFrameStart = true;
  this->mEofFound = false;
  VanSimulationDataGenerator::VanSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  this->mNumSamplesIn8Bits = 0;
  this->mIdent = 0;
  this->mCOM = '\0';
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

VanAnalyzer::VanAnalyzer() : Analyzer2(), mSettings( new VanAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );

    UseFrameV2();
}